

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  float *pfVar1;
  ImSpan<ImGuiTableColumn> *span;
  ImRect *pIVar2;
  float fVar3;
  ImVec2 IVar4;
  short sVar5;
  uint uVar6;
  uint uVar7;
  ImGuiWindow *pIVar8;
  ImGuiWindow *pIVar9;
  ImVec2 IVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  byte bVar13;
  byte bVar14;
  uint uVar15;
  ImU32 IVar16;
  ImGuiTable *p;
  ImRect *pIVar17;
  char *pcVar18;
  ImGuiTableColumn *pIVar19;
  byte bVar20;
  int iVar21;
  int iVar22;
  size_t sz;
  ImS16 IVar23;
  undefined4 uVar24;
  float fVar25;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  ImRect IVar30;
  ImGuiContext *g;
  ImGuiID local_80;
  ImRect outer_rect;
  ImSpanAllocator<3> span_allocator;
  
  pIVar11 = GImGui;
  pIVar8 = GImGui->CurrentWindow;
  pIVar8->WriteAccessed = true;
  if (pIVar8->SkipItems != false) {
    return false;
  }
  if (0x3f < columns_count - 1U) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x1f3d,"BeginTableEx","ImGui ASSERT FAILED: %s",
                "columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && \"Only 1..64 columns allowed!\""
               );
  }
  if ((((uint)flags >> 0x14 & 1) != 0) && (inner_width < 0.0)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,7999,"BeginTableEx","ImGui ASSERT FAILED: %s","inner_width >= 0.0f");
  }
  IVar10 = GetContentRegionAvail();
  fVar27 = IVar10.y;
  auVar26._8_4_ = extraout_XMM0_Dc;
  auVar26._0_4_ = IVar10.x;
  auVar26._4_4_ = IVar10.y;
  auVar26._12_4_ = extraout_XMM0_Dd;
  if (IVar10.x <= 1.0) {
    auVar26._0_4_ = 0x3f800000;
  }
  if ((flags & 0x300000U) == 0) {
    IVar10 = CalcItemSize(*outer_size,auVar26._0_4_,0.0);
    outer_rect.Min = (pIVar8->DC).CursorPos;
    outer_rect.Max.y = IVar10.y + outer_rect.Min.y;
    outer_rect.Max.x = IVar10.x + outer_rect.Min.x;
  }
  else {
    if (fVar27 <= 1.0) {
      fVar27 = 1.0;
    }
    IVar10 = CalcItemSize(*outer_size,auVar26._0_4_,fVar27);
    outer_rect.Min = (pIVar8->DC).CursorPos;
    outer_rect.Max.y = IVar10.y + outer_rect.Min.y;
    outer_rect.Max.x = IVar10.x + outer_rect.Min.x;
    bVar12 = IsClippedEx(&outer_rect,0,false);
    if (bVar12) {
      ItemSize(&outer_rect,-1.0);
      return false;
    }
  }
  uVar15 = TableFixFlags(flags);
  uVar6 = pIVar8->Flags;
  p = ImPool<ImGuiTable>::GetOrAddByKey(&pIVar11->Tables,id);
  uVar7 = p->Flags;
  iVar22 = p->LastFrameActive;
  IVar23 = 0;
  iVar21 = pIVar11->FrameCount;
  local_80 = id;
  if (iVar22 == pIVar11->FrameCount) {
    sVar5 = p->InstanceCurrent;
    IVar23 = sVar5 + 1;
    local_80 = (int)sVar5 + id + 1;
    iVar21 = iVar22;
    if ((-1 < sVar5) && (p->ColumnsCount != columns_count)) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x1f57,"BeginTableEx","ImGui ASSERT FAILED: %s",
                  "table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                 );
      iVar21 = pIVar11->FrameCount;
    }
  }
  p->ID = id;
  p->Flags = uVar6 >> 3 & 0x20 | uVar15;
  p->InstanceCurrent = IVar23;
  p->LastFrameActive = iVar21;
  p->InnerWindow = pIVar8;
  p->OuterWindow = pIVar8;
  p->ColumnsCount = columns_count;
  ImVector<char>::resize(&(p->ColumnsNames).Buf,0);
  pIVar2 = &p->WorkRect;
  p->IsInitializing = false;
  p->IsLayoutLocked = false;
  p->InnerWidth = inner_width;
  (p->OuterRect).Min = outer_rect.Min;
  (p->OuterRect).Max = outer_rect.Max;
  (p->WorkRect).Min = outer_rect.Min;
  (p->WorkRect).Max = outer_rect.Max;
  if ((flags & 0x300000U) != 0) {
    fVar27 = inner_width;
    if ((uVar15 & 0x100000) == 0) {
      fVar27 = 3.4028235e+38;
    }
    uVar24 = 0;
    fVar27 = (float)(~-(uint)(0.0 < inner_width) & 0x7f7fffff |
                    (uint)fVar27 & -(uint)(0.0 < inner_width));
    if ((((uVar15 & 0x300000) == 0x100000) || (fVar27 != 3.4028235e+38)) || (NAN(fVar27))) {
      if ((uVar15 & 0x300000) == 0x100000) {
        uVar24 = 0x800000;
      }
      span_allocator.BasePtr =
           (char *)CONCAT44(uVar24,-(uint)(fVar27 != 3.4028235e+38) & (uint)fVar27);
      SetNextWindowContentSize((ImVec2 *)&span_allocator);
    }
    IVar10 = (p->OuterRect).Min;
    IVar4 = (p->OuterRect).Max;
    span_allocator.BasePtr = (char *)CONCAT44(IVar4.y - IVar10.y,IVar4.x - IVar10.x);
    BeginChildEx(name,local_80,(ImVec2 *)&span_allocator,false,(uVar15 & 0x100000) >> 9);
    pIVar9 = pIVar11->CurrentWindow;
    p->InnerWindow = pIVar9;
    IVar10 = (pIVar9->WorkRect).Max;
    pIVar2->Min = (pIVar9->WorkRect).Min;
    (p->WorkRect).Max = IVar10;
    IVar30 = ImGuiWindow::Rect(pIVar9);
    p->OuterRect = IVar30;
  }
  PushOverrideID(0);
  pIVar9 = p->InnerWindow;
  p->HostIndentX = (pIVar9->DC).Indent.x;
  IVar10 = (pIVar9->ClipRect).Max;
  (p->HostClipRect).Min = (pIVar9->ClipRect).Min;
  (p->HostClipRect).Max = IVar10;
  p->HostSkipItems = pIVar9->SkipItems;
  IVar10 = (pIVar9->WorkRect).Max;
  (p->HostWorkRect).Min = (pIVar9->WorkRect).Min;
  (p->HostWorkRect).Max = IVar10;
  p->HostCursorMaxPos = (pIVar9->DC).CursorMaxPos;
  fVar27 = (pIVar11->Style).CellPadding.x;
  fVar3 = (pIVar11->Style).CellPadding.y;
  if ((uVar15 >> 10 & 1) == 0) {
    fVar28 = 0.0;
    fVar29 = 0.0;
    fVar25 = fVar27;
  }
  else {
    fVar28 = fVar27 + 1.0;
    fVar25 = 0.0;
    fVar29 = fVar27;
  }
  p->CellPaddingX1 = fVar28;
  p->CellPaddingX2 = fVar29;
  p->CellPaddingY = fVar3;
  p->CellSpacingX = fVar25;
  p->CurrentColumn = -1;
  p->CurrentRow = -1;
  p->RowBgColorCounter = 0;
  pIVar17 = &pIVar9->ClipRect;
  if (pIVar9 == pIVar8) {
    pIVar17 = pIVar2;
  }
  *(uint *)&p->field_0x94 = (uint)*(ushort *)&p->field_0x94;
  IVar10 = pIVar17->Max;
  (p->InnerClipRect).Min = pIVar17->Min;
  (p->InnerClipRect).Max = IVar10;
  ImRect::ClipWith(&p->InnerClipRect,pIVar2);
  ImRect::ClipWith(&p->InnerClipRect,&p->HostClipRect);
  pIVar2 = &pIVar9->ClipRect;
  if ((uVar15 >> 0x12 & 1) != 0) {
    pIVar2 = &p->WorkRect;
  }
  (p->InnerClipRect).Max.y = (pIVar2->Max).y;
  IVar10 = (p->InnerClipRect).Max;
  (p->BackgroundClipRect).Min = (p->InnerClipRect).Min;
  (p->BackgroundClipRect).Max = IVar10;
  fVar27 = (p->WorkRect).Min.y;
  p->RowPosY2 = fVar27;
  p->RowPosY1 = fVar27;
  p->RowTextBaseline = 0.0;
  bVar13 = (byte)(uVar15 >> 0x16) & 3;
  p->FreezeRowsRequest = bVar13;
  pfVar1 = &(pIVar9->Scroll).y;
  bVar20 = 0;
  if (*pfVar1 != 0.0) {
    bVar20 = bVar13;
  }
  if (NAN(*pfVar1)) {
    bVar20 = bVar13;
  }
  p->FreezeRowsCount = bVar20;
  bVar14 = (byte)(uVar15 >> 0x18) & 3;
  p->FreezeColumnsRequest = bVar14;
  bVar13 = 0;
  if ((pIVar9->Scroll).x != 0.0) {
    bVar13 = bVar14;
  }
  if (NAN((pIVar9->Scroll).x)) {
    bVar13 = bVar14;
  }
  p->FreezeColumnsCount = bVar13;
  p->IsFreezeRowsPassed = bVar20 == 0;
  p->DeclColumnsCount = '\0';
  p->RightMostVisibleColumn = -1;
  IVar16 = GetColorU32(0x2b,1.0);
  p->BorderColorStrong = IVar16;
  IVar16 = GetColorU32(0x2c,1.0);
  p->BorderColorLight = IVar16;
  fVar27 = (p->InnerClipRect).Max.x;
  p->BorderX1 = (p->InnerClipRect).Min.x;
  p->BorderX2 = fVar27;
  span_allocator.TotalSize = ImPool<ImGuiTable>::GetIndex(&pIVar11->Tables,p);
  span_allocator.BasePtr = (char *)0x0;
  ImVector<ImGuiPtrOrIndex>::push_back
            (&pIVar11->CurrentTableStack,(ImGuiPtrOrIndex *)&span_allocator);
  pIVar11->CurrentTable = p;
  (pIVar8->DC).CurrentTable = p;
  if (((uVar15 & 2) == 0) && ((uVar7 & 2) != 0)) {
    p->IsResetDisplayOrderRequest = true;
  }
  iVar22 = (int)(((long)(p->Columns).DataEnd - (long)(p->Columns).Data) / 0x68);
  if (iVar22 != columns_count && iVar22 != 0) {
    ImVector<char>::resize(&p->RawData,0);
  }
  span = &p->Columns;
  if ((p->RawData).Size == 0) {
    span_allocator.Offsets[0] = 0;
    span_allocator.Offsets[1] = 0;
    span_allocator.Offsets[2] = 0;
    span_allocator._28_4_ = 0;
    span_allocator.BasePtr = (char *)0x0;
    span_allocator.TotalSize = 0;
    span_allocator.CurrSpan = 0;
    sz = (size_t)columns_count;
    iVar21 = 0;
    ImSpanAllocator<3>::ReserveBytes(&span_allocator,0,sz * 0x68);
    ImSpanAllocator<3>::ReserveBytes(&span_allocator,1,sz);
    ImSpanAllocator<3>::ReserveBytes(&span_allocator,2,sz << 3);
    ImVector<char>::resize(&p->RawData,span_allocator.TotalSize);
    span_allocator.BasePtr = (p->RawData).Data;
    ImSpanAllocator<3>::GetSpan<ImGuiTableColumn>(&span_allocator,0,span);
    ImSpanAllocator<3>::GetSpan<signed_char>(&span_allocator,1,&p->DisplayOrderToIndex);
    ImSpanAllocator<3>::GetSpan<ImGuiTableCellData>(&span_allocator,2,&p->RowCellData);
    iVar22 = 0;
    if (0 < columns_count) {
      iVar22 = columns_count;
    }
    for (; iVar22 != iVar21; iVar21 = iVar21 + 1) {
      pIVar19 = ImSpan<ImGuiTableColumn>::operator[](span,iVar21);
      pIVar19->MaxX = 0.0;
      pIVar19->WidthOrWeightInitValue = 0.0;
      (pIVar19->ClipRect).Min.x = 0.0;
      (pIVar19->ClipRect).Min.y = 0.0;
      (pIVar19->ClipRect).Max.x = 0.0;
      (pIVar19->ClipRect).Max.y = 0.0;
      pIVar19->UserID = 0;
      pIVar19->FlagsIn = 0;
      pIVar19->Flags = 0;
      pIVar19->MinX = 0.0;
      pIVar19->WidthStretchWeight = -1.0;
      pIVar19->WidthRequest = -1.0;
      pIVar19->WidthGiven = -1.0;
      pIVar19->StartXRows = 0.0;
      pIVar19->StartXHeaders = 0.0;
      pIVar19->ContentMaxPosRowsFrozen = 0.0;
      pIVar19->ContentMaxPosRowsUnfrozen = 0.0;
      pIVar19->ContentMaxPosHeadersUsed = 0.0;
      pIVar19->ContentMaxPosHeadersIdeal = 0.0;
      pIVar19->ContentWidthRowsFrozen = 0;
      pIVar19->ContentWidthRowsUnfrozen = 0;
      pIVar19->ContentWidthHeadersUsed = 0;
      pIVar19->ContentWidthHeadersIdeal = 0;
      pIVar19->NameOffset = -1;
      pIVar19->IsVisible = true;
      pIVar19->IsVisibleNextFrame = true;
      pIVar19->IsClipped = false;
      pIVar19->SkipItems = false;
      pIVar19->DisplayOrder = -1;
      pIVar19->IndexWithinVisibleSet = -1;
      pIVar19->DrawChannelCurrent = -1;
      pIVar19->DrawChannelRowsBeforeFreeze = -1;
      pIVar19->DrawChannelRowsAfterFreeze = -1;
      pIVar19->PrevVisibleColumn = -1;
      pIVar19->NextVisibleColumn = -1;
      pIVar19->AutoFitQueue = '\a';
      pIVar19->CannotSkipItemsQueue = '\a';
      pIVar19->SortOrder = -1;
      pIVar19->SortDirection = '\0';
      pcVar18 = ImSpan<signed_char>::operator[](&p->DisplayOrderToIndex,iVar21);
      *pcVar18 = (char)iVar21;
      pIVar19 = ImSpan<ImGuiTableColumn>::operator[](span,iVar21);
      pIVar19->DisplayOrder = (char)iVar21;
    }
    p->IsSettingsRequestLoad = true;
    p->IsInitializing = true;
    p->IsSortSpecsDirty = true;
  }
  else if ((p->IsSettingsRequestLoad & 1U) == 0) goto LAB_001c534d;
  TableLoadSettings(p);
LAB_001c534d:
  fVar27 = pIVar11->FontSize;
  fVar3 = p->RefScale;
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    if ((fVar3 != fVar27) || (NAN(fVar3) || NAN(fVar27))) {
      iVar22 = 0;
      if (columns_count < 1) {
        columns_count = iVar22;
      }
      for (; columns_count != iVar22; iVar22 = iVar22 + 1) {
        pIVar19 = ImSpan<ImGuiTableColumn>::operator[](span,iVar22);
        fVar25 = pIVar19->WidthRequest;
        pIVar19 = ImSpan<ImGuiTableColumn>::operator[](span,iVar22);
        pIVar19->WidthRequest = fVar25 * (fVar27 / fVar3);
      }
    }
  }
  p->RefScale = fVar27;
  pIVar9->SkipItems = true;
  TableBeginUpdateColumns(p);
  return true;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    if (use_child_window && IsClippedEx(outer_rect, 0, false))
    {
        ItemSize(outer_rect);
        return false;
    }

    flags = TableFixFlags(flags);
    if (outer_window->Flags & ImGuiWindowFlags_NoSavedSettings)
        flags |= ImGuiTableFlags_NoSavedSettings;

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const ImGuiTableFlags table_last_flags = table->Flags;
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->ColumnsNames.Buf.resize(0);
    table->IsInitializing = false;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    table->OuterRect = outer_rect;
    table->WorkRect = outer_rect;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Create scrolling region (without border = zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, table->OuterRect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
    }

    // Push a standardized ID for both child and not-child using tables, equivalent to BeginTable() doing PushID(label) matching
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    table->HostWorkRect = inner_window->WorkRect;
    table->HostCursorMaxPos = inner_window->DC.CursorMaxPos;

    // Borders
    // - None               ........Content..... Pad .....Content........
    // - OuterV             | Pad ..Content..... Pad .....Content.. Pad |       // FIXME-TABLE: Not handled properly
    // - InnerV             ........Content.. Pad | Pad ..Content........       // FIXME-TABLE: Not handled properly
    // - OuterV+InnerV      | Pad ..Content.. Pad | Pad ..Content.. Pad |

    const bool has_cell_padding_x = (flags & ImGuiTableFlags_BordersOuterV) != 0;
    table->CellPaddingX1 = has_cell_padding_x ? g.Style.CellPadding.x + 1.0f : 0.0f;
    table->CellPaddingX2 = has_cell_padding_x ? g.Style.CellPadding.x : 0.0f;
    table->CellPaddingY = g.Style.CellPadding.y;
    table->CellSpacingX = has_cell_padding_x ? 0.0f : g.Style.CellPadding.x;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWith(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? table->WorkRect.Max.y : inner_window->ClipRect.Max.y;
    table->BackgroundClipRect = table->InnerClipRect;
    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = (ImS8)((flags & ImGuiTableFlags_ScrollFreezeRowsMask_) >> ImGuiTableFlags_ScrollFreezeRowsShift_);
    table->FreezeRowsCount = (inner_window->Scroll.y != 0.0f) ? table->FreezeRowsRequest : 0;
    table->FreezeColumnsRequest = (ImS8)((flags & ImGuiTableFlags_ScrollFreezeColumnsMask_) >> ImGuiTableFlags_ScrollFreezeColumnsShift_);
    table->FreezeColumnsCount = (inner_window->Scroll.x != 0.0f) ? table->FreezeColumnsRequest : 0;
    table->IsFreezeRowsPassed = (table->FreezeRowsCount == 0);
    table->DeclColumnsCount = 0;
    table->RightMostVisibleColumn = -1;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // Make table current
    g.CurrentTableStack.push_back(ImGuiPtrOrIndex(g.Tables.GetIndex(table)));
    g.CurrentTable = table;
    outer_window->DC.CurrentTable = table;
    if ((table_last_flags & ImGuiTableFlags_Reorderable) && !(flags & ImGuiTableFlags_Reorderable))
        table->IsResetDisplayOrderRequest = true;

    // Setup default columns state. Clear data if columns count changed
    const int stored_size = table->Columns.size();
    if (stored_size != 0 && stored_size != columns_count)
        table->RawData.resize(0);
    if (table->RawData.Size == 0)
    {
        // Allocate single buffer for our arrays
        ImSpanAllocator<3> span_allocator;
        span_allocator.ReserveBytes(0, columns_count * sizeof(ImGuiTableColumn));
        span_allocator.ReserveBytes(1, columns_count * sizeof(ImS8));
        span_allocator.ReserveBytes(2, columns_count * sizeof(ImGuiTableCellData));
        table->RawData.resize(span_allocator.GetArenaSizeInBytes());
        span_allocator.SetArenaBasePtr(table->RawData.Data);
        span_allocator.GetSpan(0, &table->Columns);
        span_allocator.GetSpan(1, &table->DisplayOrderToIndex);
        span_allocator.GetSpan(2, &table->RowCellData);

        for (int n = 0; n < columns_count; n++)
        {
            table->Columns[n] = ImGuiTableColumn();
            table->Columns[n].DisplayOrder = table->DisplayOrderToIndex[n] = (ImS8)n;
        }
        table->IsInitializing = table->IsSettingsRequestLoad = table->IsSortSpecsDirty = true;
    }

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextCell() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Update/lock which columns will be Visible for the frame
    TableBeginUpdateColumns(table);

    return true;
}